

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O2

IImage * __thiscall irr::video::CImageLoaderBMP::loadImage(CImageLoaderBMP *this,IReadFile *file)

{
  int iVar1;
  undefined4 extraout_var;
  s32 *palette;
  IImage *this_00;
  uint uVar2;
  char *this_01;
  uint uVar3;
  ulong uVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar6;
  float fVar7;
  u8 *bmpData;
  dimension2d<unsigned_int> local_68;
  SBMPHeader header;
  
  (**file->_vptr_IReadFile)(file,&header,0x36);
  if (header.Id != 0x4d42) {
    return (IImage *)0x0;
  }
  if (2 < header.Compression) {
    this_01 = "Compression mode not supported.";
LAB_00217e54:
    os::Printer::log((Printer *)this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    return (IImage *)0x0;
  }
  if (((0x20 < header.BPP) || (23000 < header.Width)) || (23000 < header.Height)) {
    this_01 = "Rejecting BMP with unreasonable size or BPP.";
    goto LAB_00217e54;
  }
  header.BitmapDataSize = (-header.BitmapDataSize & 3) + header.BitmapDataSize;
  iVar1 = (*file->_vptr_IReadFile[3])(file);
  uVar2 = (uint)((long)((ulong)header.BitmapDataOffset - CONCAT44(extraout_var,iVar1)) / 4);
  if ((int)uVar2 < 1) {
    palette = (s32 *)0x0;
  }
  else {
    uVar3 = 0x100;
    if (uVar2 < 0x100) {
      uVar3 = uVar2;
    }
    palette = (s32 *)operator_new__(0x400);
    memset(palette,0,0x400);
    (**file->_vptr_IReadFile)(file,palette,(ulong)(uVar3 << 2));
  }
  if (header.BitmapDataSize == 0) {
    iVar1 = (*file->_vptr_IReadFile[2])(file);
    header.BitmapDataSize = iVar1 - header.BitmapDataOffset;
  }
  (*file->_vptr_IReadFile[1])(file,(ulong)header.BitmapDataOffset,0);
  uVar4 = (ulong)header.BitmapDataSize;
  fVar7 = (float)header.BPP * 0.125 * (float)header.Width;
  iVar1 = (int)fVar7 + (uint)((float)(int)fVar7 != fVar7);
  uVar2 = -iVar1 & 3;
  bmpData = (u8 *)operator_new__(uVar4);
  (**file->_vptr_IReadFile)(file,bmpData,uVar4);
  if (header.Compression == 1) {
    decompress8BitRLE((CImageLoaderBMP *)file,&bmpData,header.BitmapDataSize,header.Width,
                      header.Height,uVar2);
    uVar5 = extraout_XMM0_Da_02;
    uVar6 = extraout_XMM0_Db_02;
    uVar3 = header.Width;
  }
  else {
    uVar5 = extraout_XMM0_Da_00;
    uVar6 = extraout_XMM0_Db_00;
    if (header.Compression != 2) goto LAB_00217fe5;
    decompress4BitRLE((CImageLoaderBMP *)file,&bmpData,header.BitmapDataSize,header.Width,
                      header.Height,uVar2);
    uVar5 = extraout_XMM0_Da_01;
    uVar6 = extraout_XMM0_Db_01;
    uVar3 = header.Width + 1 >> 1;
  }
  header.BitmapDataSize = (uVar3 + uVar2) * header.Height;
LAB_00217fe5:
  if (header.BitmapDataSize < (iVar1 + uVar2) * header.Height) {
    os::Printer::log((Printer *)"Bitmap data is cut off.",(double)CONCAT44(uVar6,uVar5));
    if (palette != (s32 *)0x0) {
      operator_delete__(palette);
    }
    if (bmpData == (u8 *)0x0) {
      return (IImage *)0x0;
    }
    operator_delete__(bmpData);
    return (IImage *)0x0;
  }
  local_68.Width = header.Width;
  if (header.BPP == 0x20) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_A8R8G8B8,&local_68);
    CColorConverter::convert32BitTo32Bit
              ((s32 *)bmpData,(s32 *)this_00->Data,header.Width,header.Height,uVar2,true);
  }
  else if (header.BPP == 4) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_A1R5G5B5,&local_68);
    CColorConverter::convert4BitTo16Bit
              (bmpData,(s16 *)this_00->Data,header.Width,header.Height,palette,uVar2,true);
  }
  else if (header.BPP == 8) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_A1R5G5B5,&local_68);
    CColorConverter::convert8BitTo16Bit
              (bmpData,(s16 *)this_00->Data,header.Width,header.Height,palette,uVar2,true);
  }
  else if (header.BPP == 0x10) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_A1R5G5B5,&local_68);
    CColorConverter::convert16BitTo16Bit
              ((s16 *)bmpData,(s16 *)this_00->Data,header.Width,header.Height,uVar2,true);
  }
  else if (header.BPP == 0x18) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_R8G8B8,&local_68);
    CColorConverter::convert24BitTo24Bit
              (bmpData,this_00->Data,header.Width,header.Height,uVar2,true,true);
  }
  else if (header.BPP == 1) {
    this_00 = (IImage *)operator_new(0x50);
    CImage::CImage((CImage *)this_00,ECF_A1R5G5B5,&local_68);
    CColorConverter::convert1BitTo16Bit
              (bmpData,(s16 *)this_00->Data,header.Width,header.Height,uVar2,true);
  }
  else {
    this_00 = (IImage *)0x0;
  }
  if (palette != (s32 *)0x0) {
    operator_delete__(palette);
  }
  if (bmpData != (u8 *)0x0) {
    operator_delete__(bmpData);
    return this_00;
  }
  return this_00;
}

Assistant:

IImage *CImageLoaderBMP::loadImage(io::IReadFile *file) const
{
	SBMPHeader header;

	file->read(&header, sizeof(header));

#ifdef __BIG_ENDIAN__
	header.Id = os::Byteswap::byteswap(header.Id);
	header.FileSize = os::Byteswap::byteswap(header.FileSize);
	header.BitmapDataOffset = os::Byteswap::byteswap(header.BitmapDataOffset);
	header.BitmapHeaderSize = os::Byteswap::byteswap(header.BitmapHeaderSize);
	header.Width = os::Byteswap::byteswap(header.Width);
	header.Height = os::Byteswap::byteswap(header.Height);
	header.Planes = os::Byteswap::byteswap(header.Planes);
	header.BPP = os::Byteswap::byteswap(header.BPP);
	header.Compression = os::Byteswap::byteswap(header.Compression);
	header.BitmapDataSize = os::Byteswap::byteswap(header.BitmapDataSize);
	header.PixelPerMeterX = os::Byteswap::byteswap(header.PixelPerMeterX);
	header.PixelPerMeterY = os::Byteswap::byteswap(header.PixelPerMeterY);
	header.Colors = os::Byteswap::byteswap(header.Colors);
	header.ImportantColors = os::Byteswap::byteswap(header.ImportantColors);
#endif

	s32 pitch = 0;

	//! return if the header is false

	if (header.Id != 0x4d42)
		return 0;

	if (header.Compression > 2) { // we'll only handle RLE-Compression
		os::Printer::log("Compression mode not supported.", ELL_ERROR);
		return 0;
	}

	if (header.BPP > 32 || !checkImageDimensions(header.Width, header.Height)) {
		os::Printer::log("Rejecting BMP with unreasonable size or BPP.", ELL_ERROR);
		return 0;
	}

	// adjust bitmap data size to dword boundary
	header.BitmapDataSize += (4 - (header.BitmapDataSize % 4)) % 4;

	// read palette

	long pos = file->getPos();
	constexpr s32 paletteAllocSize = 256;
	s32 paletteSize = (header.BitmapDataOffset - pos) / 4;
	paletteSize = core::clamp(paletteSize, 0, paletteAllocSize);

	s32 *paletteData = 0;
	if (paletteSize) {
		// always allocate an 8-bit palette to ensure enough space
		paletteData = new s32[paletteAllocSize];
		memset(paletteData, 0, paletteAllocSize * sizeof(s32));
		file->read(paletteData, paletteSize * sizeof(s32));
#ifdef __BIG_ENDIAN__
		for (s32 i = 0; i < paletteSize; ++i)
			paletteData[i] = os::Byteswap::byteswap(paletteData[i]);
#endif
	}

	// read image data

	if (!header.BitmapDataSize) {
		// okay, lets guess the size
		// some tools simply don't set it
		header.BitmapDataSize = static_cast<u32>(file->getSize()) - header.BitmapDataOffset;
	}

	file->seek(header.BitmapDataOffset);

	s32 widthInBytes;
	{
		f32 t = (header.Width) * (header.BPP / 8.0f);
		widthInBytes = (s32)t;
		t -= widthInBytes;
		if (t != 0.0f)
			++widthInBytes;
	}

	const s32 lineSize = widthInBytes + ((4 - (widthInBytes % 4))) % 4;
	pitch = lineSize - widthInBytes;

	u8 *bmpData = new u8[header.BitmapDataSize];
	file->read(bmpData, header.BitmapDataSize);

	// decompress data if needed
	switch (header.Compression) {
	case 1: // 8 bit rle
		decompress8BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = (header.Width + pitch) * header.Height;
		break;
	case 2: // 4 bit rle
		decompress4BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = ((header.Width + 1) / 2 + pitch) * header.Height;
		break;
	}

	if (header.BitmapDataSize < lineSize * header.Height) {
		os::Printer::log("Bitmap data is cut off.", ELL_ERROR);

		delete[] paletteData;
		delete[] bmpData;
		return 0;
	}

	// create surface
	core::dimension2d<u32> dim;
	dim.Width = header.Width;
	dim.Height = header.Height;

	IImage *image = 0;
	switch (header.BPP) {
	case 1:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert1BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 4:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert4BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 8:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert8BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 16:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8, dim);
		if (image)
			CColorConverter::convert24BitTo24Bit(bmpData, (u8 *)image->getData(), header.Width, header.Height, pitch, true, true);
		break;
	case 32: // thx to Reinhard Ostermeier
		image = new CImage(ECF_A8R8G8B8, dim);
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)bmpData, (s32 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	};

	// clean up

	delete[] paletteData;
	delete[] bmpData;

	return image;
}